

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

size_t __thiscall google::protobuf::EnumDescriptorProto::ByteSizeLong(EnumDescriptorProto *this)

{
  RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *this_00;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange> *this_01;
  uint uVar1;
  anon_union_104_1_493b367e_for_EnumDescriptorProto_3 aVar2;
  void **ppvVar3;
  const_iterator cVar4;
  size_t sVar5;
  const_iterator cVar6;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *value;
  size_t sVar7;
  ulong uVar8;
  uint index;
  uint uVar9;
  long lVar10;
  
  lVar10 = (long)*(int *)((long)&this->field_0 + 0x10);
  this_00 = &(this->field_0)._impl_.value_;
  ppvVar3 = internal::RepeatedPtrFieldBase::elements(&this_00->super_RepeatedPtrFieldBase);
  cVar4 = RepeatedPtrField<google::protobuf::EnumValueDescriptorProto>::end(this_00);
  for (; ppvVar3 != cVar4.it_; ppvVar3 = ppvVar3 + 1) {
    sVar5 = internal::WireFormatLite::MessageSize<google::protobuf::EnumValueDescriptorProto>
                      ((EnumValueDescriptorProto *)*ppvVar3);
    lVar10 = lVar10 + sVar5;
  }
  lVar10 = lVar10 + *(int *)((long)&this->field_0 + 0x28);
  this_01 = &(this->field_0)._impl_.reserved_range_;
  ppvVar3 = internal::RepeatedPtrFieldBase::elements(&this_01->super_RepeatedPtrFieldBase);
  cVar6 = RepeatedPtrField<google::protobuf::EnumDescriptorProto_EnumReservedRange>::end(this_01);
  for (; ppvVar3 != cVar6.it_; ppvVar3 = ppvVar3 + 1) {
    sVar5 = internal::WireFormatLite::
            MessageSize<google::protobuf::EnumDescriptorProto_EnumReservedRange>
                      ((EnumDescriptorProto_EnumReservedRange *)*ppvVar3);
    lVar10 = lVar10 + sVar5;
  }
  uVar1 = *(uint *)((long)&this->field_0 + 0x40);
  sVar5 = lVar10 + (ulong)uVar1;
  uVar9 = 0;
  index = 0;
  if (0 < (int)uVar1) {
    uVar9 = uVar1;
    index = 0;
  }
  for (; uVar9 != index; index = index + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                      (&(this->field_0)._impl_.reserved_name_.super_RepeatedPtrFieldBase,index);
    sVar7 = internal::WireFormatLite::StringSize(value);
    sVar5 = sVar5 + sVar7;
  }
  aVar2 = this->field_0;
  if (((undefined1  [104])aVar2 & (undefined1  [104])0x7) != (undefined1  [104])0x0) {
    if (((undefined1  [104])aVar2 & (undefined1  [104])0x1) != (undefined1  [104])0x0) {
      sVar7 = internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
                        );
      sVar5 = sVar5 + sVar7 + 1;
    }
    if (((undefined1  [104])aVar2 & (undefined1  [104])0x2) != (undefined1  [104])0x0) {
      sVar7 = internal::WireFormatLite::MessageSize<google::protobuf::EnumOptions>
                        ((this->field_0)._impl_.options_);
      sVar5 = sVar5 + sVar7 + 1;
    }
    if (((undefined1  [104])aVar2 & (undefined1  [104])0x4) != (undefined1  [104])0x0) {
      uVar8 = (long)(this->field_0)._impl_.visibility_ | 1;
      lVar10 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar10 == 0; lVar10 = lVar10 + -1) {
        }
      }
      sVar5 = sVar5 + ((int)lVar10 * 9 + 0x49U >> 6) + 1;
    }
  }
  sVar5 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar5,&(this->field_0)._impl_._cached_size_);
  return sVar5;
}

Assistant:

::size_t EnumDescriptorProto::ByteSizeLong() const {
  const EnumDescriptorProto& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.EnumDescriptorProto)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.EnumValueDescriptorProto value = 2;
    {
      total_size += 1UL * this_._internal_value_size();
      for (const auto& msg : this_._internal_value()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .google.protobuf.EnumDescriptorProto.EnumReservedRange reserved_range = 4;
    {
      total_size += 1UL * this_._internal_reserved_range_size();
      for (const auto& msg : this_._internal_reserved_range()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated string reserved_name = 5;
    {
      total_size +=
          1 * ::google::protobuf::internal::FromIntSize(this_._internal_reserved_name().size());
      for (int i = 0, n = this_._internal_reserved_name().size(); i < n; ++i) {
        total_size += ::google::protobuf::internal::WireFormatLite::StringSize(
            this_._internal_reserved_name().Get(i));
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000007u) != 0) {
    // optional string name = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_name());
    }
    // optional .google.protobuf.EnumOptions options = 3;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.options_);
    }
    // optional .google.protobuf.SymbolVisibility visibility = 6;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_visibility());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}